

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
format_uint<1u,char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,unsigned_long value,
          int num_digits,bool upper)

{
  type tVar1;
  char16_t *buffer_00;
  char buffer [65];
  char acStack_68 [72];
  
  tVar1 = to_unsigned<int>(num_digits);
  buffer_00 = to_pointer<char16_t>((buffer_appender<char16_t>)out.container,(ulong)tVar1);
  if (buffer_00 == (char16_t *)0x0) {
    format_uint<1u,char,unsigned_long>(acStack_68,value,num_digits,upper);
    out = copy_str_noinline<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                    (acStack_68,acStack_68 + num_digits,out);
  }
  else {
    format_uint<1u,char16_t,unsigned_long>(buffer_00,value,num_digits,upper);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}